

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper_tests.cpp
# Opt level: O0

void __thiscall dbwrapper_tests::existing_data_reindex::test_method(existing_data_reindex *this)

{
  bool bVar1;
  undefined1 uVar2;
  CDBWrapper *this_00;
  long in_FS_OFFSET;
  uint8_t key;
  unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> dbw;
  uint256 res3;
  uint256 in2;
  uint256 res2;
  CDBWrapper odbw;
  uint256 res;
  uint256 in;
  path ph;
  char *in_stack_fffffffffffff8e8;
  ArgsManager *in_stack_fffffffffffff8f0;
  char *in_stack_fffffffffffff8f8;
  path *in_stack_fffffffffffff900;
  DBParams *in_stack_fffffffffffff910;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff918;
  uchar *puVar3;
  undefined7 in_stack_fffffffffffff920;
  undefined1 in_stack_fffffffffffff927;
  lazy_ostream *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  uchar *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  undefined1 local_5d8 [16];
  undefined1 local_5c8 [16];
  DBParams *in_stack_fffffffffffffa48;
  CDBWrapper *in_stack_fffffffffffffa50;
  lazy_ostream local_568 [2];
  assertion_result local_548 [2];
  const_string local_510 [2];
  lazy_ostream local_4f0 [2];
  assertion_result local_4d0 [2];
  const_string local_498 [2];
  lazy_ostream local_478 [2];
  assertion_result local_458 [2];
  const_string local_420 [2];
  lazy_ostream local_400 [2];
  assertion_result local_3e0 [2];
  undefined1 local_3a8 [16];
  undefined1 local_398 [64];
  const_string local_358 [2];
  lazy_ostream local_338 [2];
  assertion_result local_318 [2];
  const_string local_2e0 [2];
  lazy_ostream local_2c0 [2];
  assertion_result local_2a0 [2];
  undefined1 local_261;
  undefined1 local_258 [360];
  undefined1 local_f0 [136];
  _List local_68;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase(in_stack_fffffffffffff8f0);
  fs::operator/(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  fs::path::~path((path *)in_stack_fffffffffffff8e8);
  fs::create_directories((path *)in_stack_fffffffffffff8f0);
  fs::path::path((path *)in_stack_fffffffffffff8e8,(path *)0x5ac76f);
  local_68._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x400;
  local_60 = 0;
  local_5f = 0;
  local_5e = 0;
  local_5d = 0;
  std::make_unique<CDBWrapper,DBParams>(in_stack_fffffffffffff910);
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffff8e8);
  local_261 = 0x6b;
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff918);
  uint256::uint256((uint256 *)in_stack_fffffffffffff8e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff8e8
              );
    CDBWrapper::Write<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (uchar *)in_stack_fffffffffffff928,
               (uint256 *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a0,local_2c0,local_2e0,0x103,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::operator->
              ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff8e8
              );
    CDBWrapper::Read<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               in_stack_fffffffffffff938,
               (uint256 *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_318,local_338,local_358,0x104,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,(char (*) [1])in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff8f0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff8f0);
    in_stack_fffffffffffff8f8 = "in.ToString()";
    in_stack_fffffffffffff8f0 = (ArgsManager *)(local_258 + 0x148);
    in_stack_fffffffffffff8e8 = "res.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_398,local_3a8,0x105,1,2,local_f0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::reset
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff8e8,
             (pointer)0x5acc75);
  fs::path::path((path *)in_stack_fffffffffffff8e8,(path *)0x5acc8a);
  local_258._200_8_ = (_Base_ptr)0x400;
  local_258[0xd0] = 0;
  local_258[0xd1] = 1;
  local_258[0xd2] = 1;
  local_258[0xd3] = 0;
  CDBWrapper::CDBWrapper(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
  DBParams::~DBParams((DBParams *)in_stack_fffffffffffff8e8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff8e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    CDBWrapper::Read<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
               in_stack_fffffffffffff938,
               (uint256 *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_3e0,local_400,local_420,0x10f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    dbwrapper_private::GetObfuscateKey((CDBWrapper *)in_stack_fffffffffffff8e8);
    is_null_key((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff8f8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    this_00 = (CDBWrapper *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_458,local_478,local_498,0x110,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff918);
  uint256::uint256((uint256 *)in_stack_fffffffffffff8e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    CDBWrapper::Write<unsigned_char,uint256>
              ((CDBWrapper *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (uchar *)in_stack_fffffffffffff928,
               (uint256 *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               SUB81((ulong)in_stack_fffffffffffff918 >> 0x38,0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4d0,local_4f0,local_510,0x116,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)in_stack_fffffffffffff918,(const_string *)in_stack_fffffffffffff910);
    in_stack_fffffffffffff937 =
         CDBWrapper::Read<unsigned_char,uint256>
                   ((CDBWrapper *)CONCAT17(uVar2,in_stack_fffffffffffff940),puVar3,
                    (uint256 *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff8f8,
               SUB81((ulong)in_stack_fffffffffffff8f0 >> 0x38,0));
    in_stack_fffffffffffff928 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,
               (basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff8e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_548,local_568,(const_string *)&stack0xfffffffffffffa78,0x117,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff8e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff8e8);
    in_stack_fffffffffffff927 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff927);
  do {
    puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff928,
               (const_string *)CONCAT17(in_stack_fffffffffffff927,in_stack_fffffffffffff920),
               (size_t)puVar3,(const_string *)in_stack_fffffffffffff910);
    in_stack_fffffffffffff910 = (DBParams *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff8f0,(char (*) [1])in_stack_fffffffffffff8e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff8f8,
               (pointer)in_stack_fffffffffffff8f0,(unsigned_long)in_stack_fffffffffffff8e8);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff8f0);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff8f0);
    in_stack_fffffffffffff8f8 = "in2.ToString()";
    in_stack_fffffffffffff8f0 = (ArgsManager *)local_258;
    in_stack_fffffffffffff8e8 = "res3.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_5c8,local_5d8,0x118,1,2,local_258 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff8e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CDBWrapper::~CDBWrapper(this_00);
  std::unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_>::~unique_ptr
            ((unique_ptr<CDBWrapper,_std::default_delete<CDBWrapper>_> *)in_stack_fffffffffffff8f8);
  fs::path::~path((path *)in_stack_fffffffffffff8e8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(existing_data_reindex)
{
    // We're going to share this fs::path between two wrappers
    fs::path ph = m_args.GetDataDirBase() / "existing_data_reindex";
    fs::create_directories(ph);

    // Set up a non-obfuscated wrapper to write some initial data.
    std::unique_ptr<CDBWrapper> dbw = std::make_unique<CDBWrapper>(DBParams{.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = false, .obfuscate = false});
    uint8_t key{'k'};
    uint256 in = m_rng.rand256();
    uint256 res;

    BOOST_CHECK(dbw->Write(key, in));
    BOOST_CHECK(dbw->Read(key, res));
    BOOST_CHECK_EQUAL(res.ToString(), in.ToString());

    // Call the destructor to free leveldb LOCK
    dbw.reset();

    // Simulate a -reindex by wiping the existing data store
    CDBWrapper odbw({.path = ph, .cache_bytes = 1 << 10, .memory_only = false, .wipe_data = true, .obfuscate = true});

    // Check that the key/val we wrote with unobfuscated wrapper doesn't exist
    uint256 res2;
    BOOST_CHECK(!odbw.Read(key, res2));
    BOOST_CHECK(!is_null_key(dbwrapper_private::GetObfuscateKey(odbw)));

    uint256 in2 = m_rng.rand256();
    uint256 res3;

    // Check that we can write successfully
    BOOST_CHECK(odbw.Write(key, in2));
    BOOST_CHECK(odbw.Read(key, res3));
    BOOST_CHECK_EQUAL(res3.ToString(), in2.ToString());
}